

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::INIError::INIError(INIError *this,string *INIError,string *msg,ExitCodes exit_code)

{
  string sStack_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)INIError);
  ::std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&sStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_001664f8;
  return;
}

Assistant:

static INIError Extras(std::string item) { return INIError("INI was not able to parse " + item); }